

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory_Banks.c
# Opt level: O0

uint8_t gb_read_mbc_5(MemoryBankController *mc,uint16_t address)

{
  int read_addr_1;
  int ram_bank;
  int offset_1;
  int read_addr;
  int offset;
  uint16_t address_local;
  MemoryBankController *mc_local;
  
  if (address < 0x4000) {
    mc_local._7_1_ = mc->rom[address];
  }
  else if ((address < 0x4000) || (0x7fff < address)) {
    if ((address < 0xa000) || (0xbfff < address)) {
      mc_local._7_1_ = gb_common_reads(mc,address);
    }
    else if ((mc->ram_enabled & 1U) == 0) {
      mc_local._7_1_ = 0xff;
    }
    else {
      mc_local._7_1_ =
           mc->ram[(int)((address - 0xa000) +
                        ((uint)mc->banking_register_2 & mc->ram_bank_mask) * 0x2000)];
    }
  }
  else {
    mc_local._7_1_ =
         mc->rom[(int)((address - 0x4000) +
                      ((uint)mc->banking_register_1 & mc->rom_bank_mask) * 0x4000)];
  }
  return mc_local._7_1_;
}

Assistant:

uint8_t gb_read_mbc_5(MemoryBankController* mc, uint16_t address) {

    //Always contains the first 16kbs of rom for MBC 5
    if (address <= 0x3FFF) {
        return mc->rom[address];
    }

    //Can contain banks up to 0x1FF, including bank 0
    if(address >= 0x4000 && address <= 0x7FFF) {
        int offset = address - ROM_BANK_SIZE;
        int read_addr = offset + (mc->banking_register_1 & mc->rom_bank_mask) * ROM_BANK_SIZE;
        return mc->rom[read_addr];
    }
    
    //Same as for MBC1, but can contain more ram
    if (address >= 0xA000 && address <= 0xBFFF) {
        if (mc->ram_enabled) {
            int offset = address - 0xA000;
            int ram_bank = mc->banking_register_2;
            int read_addr = offset + (ram_bank & mc->ram_bank_mask) * RAM_BANK_SIZE;
            return mc->ram[read_addr];
        }
        return 0xFF;
    }

    return gb_common_reads(mc, address);
}